

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compress2(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  size_t sVar1;
  size_t oPos;
  size_t iPos;
  
  cctx->streamStage = zcss_init;
  cctx->pledgedSrcSizePlusOne = 0;
  oPos = 0;
  iPos = 0;
  sVar1 = ZSTD_compressStream2_simpleArgs(cctx,dst,dstCapacity,&oPos,src,srcSize,&iPos,ZSTD_e_end);
  if (sVar1 != 0) {
    oPos = 0xffffffffffffffba;
  }
  if (0xffffffffffffff88 < sVar1) {
    oPos = sVar1;
  }
  return oPos;
}

Assistant:

size_t ZSTD_compress2(ZSTD_CCtx* cctx,
                      void* dst, size_t dstCapacity,
                      const void* src, size_t srcSize)
{
    ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
    {   size_t oPos = 0;
        size_t iPos = 0;
        size_t const result = ZSTD_compressStream2_simpleArgs(cctx,
                                        dst, dstCapacity, &oPos,
                                        src, srcSize, &iPos,
                                        ZSTD_e_end);
        if (ZSTD_isError(result)) return result;
        if (result != 0) {  /* compression not completed, due to lack of output space */
            assert(oPos == dstCapacity);
            return ERROR(dstSize_tooSmall);
        }
        assert(iPos == srcSize);   /* all input is expected consumed */
        return oPos;
    }
}